

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeCasts.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_168::BestCastFinder::visitLocalGet(BestCastFinder *this,LocalGet *curr)

{
  bool bVar1;
  pointer ppVar2;
  mapped_type *this_00;
  Expression *local_30;
  Expression *bestCast;
  _Node_iterator_base<std::pair<const_unsigned_int,_wasm::Expression_*>,_false> local_20;
  iterator iter;
  LocalGet *curr_local;
  BestCastFinder *this_local;
  
  iter.super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Expression_*>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_int,_wasm::Expression_*>,_false>)
       (_Node_iterator_base<std::pair<const_unsigned_int,_wasm::Expression_*>,_false>)curr;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_wasm::Expression_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Expression_*>_>_>
       ::find(&this->mostCastedGets,&curr->index);
  bestCast = (Expression *)
             std::
             unordered_map<unsigned_int,_wasm::Expression_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Expression_*>_>_>
             ::end(&this->mostCastedGets);
  bVar1 = std::__detail::operator!=
                    (&local_20,
                     (_Node_iterator_base<std::pair<const_unsigned_int,_wasm::Expression_*>,_false>
                      *)&bestCast);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_wasm::Expression_*>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_int,_wasm::Expression_*>,_false,_false>
                         *)&local_20);
    local_30 = ppVar2->second;
    bVar1 = wasm::Type::operator!=
                      ((Type *)((long)iter.
                                      super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Expression_*>,_false>
                                      ._M_cur + 8),&local_30->type);
    if ((bVar1) &&
       (bVar1 = wasm::Type::isSubType
                          ((Type)(local_30->type).id,
                           (Type)*(uintptr_t *)
                                  ((long)iter.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Expression_*>,_false>
                                         ._M_cur + 8)), bVar1)) {
      this_00 = std::
                unordered_map<wasm::Expression_*,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>_>
                ::operator[](&this->lessCastedGets,&local_30);
      std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::push_back
                (this_00,(value_type *)&iter);
    }
  }
  return;
}

Assistant:

void visitLocalGet(LocalGet* curr) {
    auto iter = mostCastedGets.find(curr->index);
    if (iter != mostCastedGets.end()) {
      auto* bestCast = iter->second;
      if (curr->type != bestCast->type &&
          Type::isSubType(bestCast->type, curr->type)) {
        // The best cast has a more refined type, note that we want to use it.
        lessCastedGets[bestCast].push_back(curr);
      }
    }
  }